

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLeft2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *eps,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec,int *idx,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *rhs,int *ridx,int rn,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *rhs2,int *ridx2,int rn2)

{
  int iVar1;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int in_stack_000000b4;
  undefined4 in_stack_000000b8;
  int in_stack_000000bc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000d0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000000e0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000e8;
  int in_stack_0000011c;
  int *in_stack_00000120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000130;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000138;
  int in_stack_000002a0;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc80;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc90;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330 [2];
  undefined1 local_230 [128];
  undefined1 local_1b0 [128];
  undefined1 local_130 [184];
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *eps_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (*(int *)(in_RDI + 0x2f8) == 0) {
    local_78 = local_130;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    in_stack_00000008 =
         solveUpdateLeft(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                         in_stack_0000011c);
    local_68 = local_1b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    solveUleft(in_stack_000000e8,in_stack_000000e0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_000000d8,(int *)in_stack_000000d0,in_stack_000000c8,
               (int *)in_stack_000000c0,in_stack_000002a0);
    local_58 = local_230;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_00000008));
    solveUpdateLeft(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                    in_stack_0000011c);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_00000008));
    solveUleftNoNZ(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                   (int *)CONCAT44(in_stack_000000bc,in_stack_000000b8),in_stack_000000b4);
  }
  else {
    eps_00 = local_330;
    vec_00 = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    solveUleft(in_stack_000000e8,in_stack_000000e0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_000000d8,(int *)in_stack_000000d0,in_stack_000000c8,
               (int *)in_stack_000000c0,in_stack_000002a0);
    this_00 = in_RSI;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_00000008));
    solveLleftForest(this_00,eps_00,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)vec_00,in_stack_ffffffffffffffb8,iVar1);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_RSI,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_00000008));
    solveUleftNoNZ(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                   (int *)CONCAT44(in_stack_000000bc,in_stack_000000b8),in_stack_000000b4);
    solveLleftForestNoNZ(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_RSI,
             (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_00000008)
            );
  iVar1 = solveLleft(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,(int *)in_stack_000000c0,
                     in_stack_000000bc);
  solveLleftNoNZ(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft2(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2)        /* rhs2    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);

   return rn;
}